

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O3

StringRef llvm::sys::getHostCPUName(void)

{
  uint *puVar1;
  uint *puVar2;
  long lVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  bool bVar16;
  uint in_XCR0;
  StringRef SVar17;
  
  puVar1 = (uint *)cpuid_basic_info(0);
  sVar9 = 7;
  pcVar10 = "generic";
  if (*puVar1 == 0) goto LAB_0017517a;
  puVar2 = (uint *)cpuid_Version_info(1);
  uVar11 = *puVar2;
  uVar5 = puVar2[3];
  uVar14 = uVar11 >> 8 & 0xf;
  uVar13 = uVar11 >> 4 & 0xf;
  if (uVar14 == 6) {
LAB_00175026:
    uVar13 = uVar13 | uVar11 >> 0xc & 0xf0;
  }
  else if (uVar14 == 0xf) {
    uVar14 = (uVar11 >> 0x14 & 0xff) + 0xf;
    goto LAB_00175026;
  }
  uVar11 = puVar2[2] >> 0x16 & 0x1a | uVar5 >> 0xc & 0x180 | uVar5 >> 3 & 0x40 | (uVar5 & 1) << 5;
  if ((~uVar5 & 0x18000000) == 0) {
    bVar15 = (~in_XCR0 & 0xe6) == 0;
    bVar16 = (~in_XCR0 & 6) == 0;
    uVar12 = uVar11 + 0x200;
    if (!bVar16) {
      uVar12 = uVar11;
    }
  }
  else {
    bVar15 = false;
    bVar16 = false;
    uVar12 = uVar11;
  }
  uVar11 = uVar5 >> 0x16 & 1;
  if (6 < *puVar1) {
    lVar3 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar5 = *(uint *)(lVar3 + 4);
    uVar8 = uVar12 + 0x400;
    if (!bVar16) {
      uVar8 = uVar12;
    }
    if ((uVar5 & 0x20) == 0) {
      uVar8 = uVar12;
    }
    uVar12 = uVar8 + 0x1000000;
    if (!bVar15) {
      uVar12 = uVar8;
    }
    if ((uVar5 >> 0x1b & 1) == 0) {
      uVar12 = uVar8;
    }
    uVar6 = uVar8;
    if (bVar15) {
      uVar6 = uVar12;
    }
    if ((uVar5 >> 0x1c & 1) == 0) {
      uVar6 = uVar12;
    }
    uVar7 = uVar6 | 0x100000;
    if (!bVar15) {
      uVar7 = uVar8;
    }
    if (-1 < (int)uVar5) {
      uVar7 = uVar6;
    }
    uVar12 = uVar7 | 0x4000000;
    if (!bVar15) {
      uVar12 = uVar8;
    }
    uVar11 = uVar11 | uVar5 >> 0x19 & 0x10 | uVar5 >> 0x14 & 8 | uVar5 >> 0x12 & 2;
    if ((*(uint *)(lVar3 + 0xc) & 2) == 0) {
      uVar12 = uVar7;
    }
  }
  puVar4 = (uint *)cpuid(0x80000000);
  if (0x80000000 < *puVar4) {
    lVar3 = cpuid(0x80000001);
    uVar11 = uVar11 | *(uint *)(lVar3 + 8) >> 0x1b & 4;
  }
  if (puVar1[1] == 0x68747541) {
    switch(uVar14) {
    case 4:
      sVar9 = 4;
      pcVar10 = "i486";
      break;
    case 5:
      uVar13 = uVar13 - 6;
      if (uVar13 < 8) {
        pcVar10 = &DAT_001c4270 + *(int *)(&DAT_001c4270 + (ulong)uVar13 * 4);
        sVar9 = *(size_t *)(&DAT_001c4290 + (ulong)uVar13 * 8);
      }
      else {
        pcVar10 = "pentium";
      }
      break;
    case 6:
      pcVar10 = "athlon-xp";
      if ((uVar12 & 8) == 0) {
        pcVar10 = "athlon";
      }
      sVar9 = (ulong)((uVar12 & 8) >> 3) * 3 + 6;
      break;
    case 0xf:
      pcVar10 = "k8-sse3";
      if ((uVar12 & 0x20) == 0) {
        pcVar10 = "k8";
      }
      sVar9 = (ulong)((uVar12 & 0x20) >> 5) * 5 + 2;
      break;
    case 0x10:
      sVar9 = 8;
      pcVar10 = "amdfam10";
      break;
    case 0x14:
      sVar9 = 6;
      pcVar10 = "btver1";
      break;
    case 0x15:
      sVar9 = 6;
      if ((uVar13 & 0xffffffe0) == 0x60) {
        pcVar10 = "bdver4";
      }
      else if ((uVar13 & 0xfffffff0) == 0x30) {
        pcVar10 = "bdver3";
      }
      else {
        pcVar10 = "bdver1";
        if ((uVar13 & 0xfffffff0) == 0x10) {
          pcVar10 = "bdver2";
        }
        if (uVar13 == 2) {
          pcVar10 = "bdver2";
        }
      }
      break;
    case 0x16:
      sVar9 = 6;
      pcVar10 = "btver2";
      break;
    case 0x17:
      sVar9 = 6;
      pcVar10 = "znver1";
    }
    goto switchD_00175199_caseD_7;
  }
  if ((puVar1[1] != 0x756e6547) || ((char)puVar2[1] != '\0')) goto switchD_00175199_caseD_7;
  switch(uVar14) {
  case 3:
    pcVar10 = "i386";
    goto LAB_0017534a;
  case 4:
    pcVar10 = "i486";
LAB_0017534a:
    sVar9 = 4;
    break;
  case 5:
    pcVar10 = "pentium-mmx";
    if ((uVar12 & 2) == 0) {
      pcVar10 = "pentium";
    }
    sVar9 = (ulong)(uVar12 & 2) * 2 + 7;
    break;
  case 6:
    pcVar10 = "nehalem";
    switch(uVar13) {
    case 1:
switchD_00175330_caseD_1:
      sVar9 = 10;
      pcVar10 = "pentiumpro";
      break;
    case 2:
    case 4:
    case 0xc:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x18:
    case 0x19:
    case 0x1b:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x28:
    case 0x29:
    case 0x2b:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x38:
    case 0x39:
    case 0x3b:
    case 0x40:
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x44:
    case 0x48:
    case 0x49:
    case 0x4b:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x54:
    case 0x58:
    case 0x59:
    case 0x5b:
    case 0x60:
    case 0x61:
    case 0x62:
    case 99:
    case 100:
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x74:
    case 0x75:
    case 0x76:
    case 0x77:
    case 0x78:
    case 0x79:
    case 0x7b:
    case 0x7c:
    case 0x7d:
    case 0x7e:
    case 0x7f:
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x83:
    case 0x84:
switchD_00175330_caseD_2:
      if (uVar12 >> 0x1a != 0) goto switchD_00175330_caseD_66;
      if ((uVar12 >> 0x14 & 1) != 0) goto switchD_00175330_caseD_55;
      if ((uVar12 >> 0x18 & 1) != 0) goto switchD_00175330_caseD_57;
      if ((uVar11 & 8) != 0) {
        if ((uVar11 & 0x10) == 0) goto switchD_00175330_caseD_4e;
        goto switchD_00175330_caseD_5c;
      }
      if ((uVar11 & 2) != 0) goto switchD_00175330_caseD_3d;
      if ((uVar12 >> 10 & 1) != 0) goto switchD_00175330_caseD_3c;
      if ((uVar12 >> 9 & 1) != 0) goto switchD_00175330_caseD_2a;
      if ((uVar12 >> 8 & 1) == 0) {
        if ((char)uVar12 < '\0') goto switchD_00175330_caseD_17;
        if ((uVar12 & 0x40) == 0) {
          if ((uVar11 & 4) == 0) {
            if ((uVar12 & 0x20) != 0) goto switchD_00175330_caseD_e;
            if ((uVar12 & 0x10) != 0) goto switchD_00175330_caseD_9;
            if ((uVar12 & 8) != 0) goto switchD_00175330_caseD_7;
            if ((uVar12 & 2) != 0) goto switchD_00175330_caseD_3;
            goto switchD_00175330_caseD_1;
          }
        }
        else if ((uVar11 & 1) != 0) goto switchD_00175330_caseD_1c;
        goto switchD_00175330_caseD_f;
      }
      if ((uVar11 & 1) != 0) goto switchD_00175330_caseD_37;
      break;
    case 3:
    case 5:
    case 6:
switchD_00175330_caseD_3:
      sVar9 = 8;
      pcVar10 = "pentium2";
      break;
    case 7:
    case 8:
    case 10:
    case 0xb:
switchD_00175330_caseD_7:
      sVar9 = 8;
      pcVar10 = "pentium3";
      break;
    case 9:
    case 0xd:
    case 0x15:
switchD_00175330_caseD_9:
      sVar9 = 9;
      pcVar10 = "pentium-m";
      break;
    case 0xe:
switchD_00175330_caseD_e:
      sVar9 = 5;
      pcVar10 = "yonah";
      break;
    case 0xf:
    case 0x16:
switchD_00175330_caseD_f:
      sVar9 = 5;
      pcVar10 = "core2";
      break;
    case 0x17:
    case 0x1d:
switchD_00175330_caseD_17:
      sVar9 = 6;
      pcVar10 = "penryn";
      break;
    case 0x1a:
    case 0x1e:
    case 0x1f:
    case 0x2e:
      break;
    case 0x1c:
    case 0x26:
    case 0x27:
    case 0x35:
    case 0x36:
switchD_00175330_caseD_1c:
      pcVar10 = "bonnell";
      break;
    case 0x25:
    case 0x2c:
    case 0x2f:
      sVar9 = 8;
      pcVar10 = "westmere";
      break;
    case 0x2a:
    case 0x2d:
switchD_00175330_caseD_2a:
      sVar9 = 0xb;
      pcVar10 = "sandybridge";
      break;
    case 0x37:
    case 0x4a:
    case 0x4c:
    case 0x4d:
    case 0x5a:
    case 0x5d:
switchD_00175330_caseD_37:
      sVar9 = 10;
      pcVar10 = "silvermont";
      break;
    case 0x3a:
    case 0x3e:
      sVar9 = 9;
      pcVar10 = "ivybridge";
      break;
    case 0x3c:
    case 0x3f:
    case 0x45:
    case 0x46:
switchD_00175330_caseD_3c:
      pcVar10 = "haswell";
      break;
    case 0x3d:
    case 0x47:
    case 0x4f:
    case 0x56:
switchD_00175330_caseD_3d:
      sVar9 = 9;
      pcVar10 = "broadwell";
      break;
    case 0x55:
switchD_00175330_caseD_55:
      sVar9 = 0xe;
      pcVar10 = "skylake-avx512";
      break;
    case 0x57:
switchD_00175330_caseD_57:
      sVar9 = 3;
      pcVar10 = "knl";
      break;
    case 0x5c:
    case 0x5f:
switchD_00175330_caseD_5c:
      sVar9 = 8;
      pcVar10 = "goldmont";
      break;
    case 0x66:
switchD_00175330_caseD_66:
      sVar9 = 10;
      pcVar10 = "cannonlake";
      break;
    case 0x7a:
      sVar9 = 0xd;
      pcVar10 = "goldmont-plus";
      break;
    case 0x85:
      sVar9 = 3;
      pcVar10 = "knm";
      break;
    default:
      if ((uVar13 != 0x8e) && (uVar13 != 0x9e)) goto switchD_00175330_caseD_2;
    case 0x4e:
    case 0x5e:
switchD_00175330_caseD_4e:
      pcVar10 = "skylake";
    }
    break;
  default:
    if (uVar14 == 0xf) {
      if ((uVar11 & 4) == 0) {
        pcVar10 = "prescott";
        if ((uVar12 & 0x20) == 0) {
          pcVar10 = "pentium4";
        }
        sVar9 = 8;
      }
      else {
        sVar9 = 6;
        pcVar10 = "nocona";
      }
    }
  }
switchD_00175199_caseD_7:
LAB_0017517a:
  SVar17.Length = sVar9;
  SVar17.Data = pcVar10;
  return SVar17;
}

Assistant:

static bool getX86CpuIDAndInfo(unsigned value, unsigned *rEAX, unsigned *rEBX,
                               unsigned *rECX, unsigned *rEDX) {
#if defined(__GNUC__) || defined(__clang__)
#if defined(__x86_64__)
  // gcc doesn't know cpuid would clobber ebx/rbx. Preserve it manually.
  // FIXME: should we save this for Clang?
  __asm__("movq\t%%rbx, %%rsi\n\t"
          "cpuid\n\t"
          "xchgq\t%%rbx, %%rsi\n\t"
          : "=a"(*rEAX), "=S"(*rEBX), "=c"(*rECX), "=d"(*rEDX)
          : "a"(value));
  return false;
#elif defined(__i386__)
  __asm__("movl\t%%ebx, %%esi\n\t"
          "cpuid\n\t"
          "xchgl\t%%ebx, %%esi\n\t"
          : "=a"(*rEAX), "=S"(*rEBX), "=c"(*rECX), "=d"(*rEDX)
          : "a"(value));
  return false;
#else
  return true;
#endif
#elif defined(_MSC_VER)
  // The MSVC intrinsic is portable across x86 and x64.
  int registers[4];
  __cpuid(registers, value);
  *rEAX = registers[0];
  *rEBX = registers[1];
  *rECX = registers[2];
  *rEDX = registers[3];
  return false;
#else
  return true;
#endif
}